

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void copy_texture_line(dbg_layer_t layer)

{
  int x_1;
  int x;
  dbg_layer_t layer_local;
  
  if (layer == OBJ) {
    for (x = 0; x < 0xf0; x = x + 1) {
      *(byte *)((ulong)ppu->y * 0x3c0 + 0x629421 + (long)x * 4) =
           (char)ppu->objbuf[x].raw << 3 | (byte)ppu->objbuf[x].raw & 7;
      *(byte *)((ulong)ppu->y * 0x3c0 + 0x629422 + (long)x * 4) =
           (char)(ppu->objbuf[x].raw >> 5) << 3 | (byte)(ppu->objbuf[x].raw >> 5) & 7;
      *(byte *)((ulong)ppu->y * 0x3c0 + 0x629423 + (long)x * 4) =
           (byte)(ppu->objbuf[x].raw >> 10) << 3 | (byte)(ppu->objbuf[x].raw >> 10) & 7;
      *(undefined1 *)((ulong)ppu->y * 0x3c0 + 0x629420 + (long)x * 4) = 0xff;
    }
  }
  else {
    for (x_1 = 0; x_1 < 0xf0; x_1 = x_1 + 1) {
      *(byte *)((ulong)layer * 0x25800 + (ulong)ppu->y * 0x3c0 + 0x593421 + (long)x_1 * 4) =
           (char)ppu->bgbuf[layer][x_1].raw << 3 | (byte)ppu->bgbuf[layer][x_1].raw & 7;
      *(byte *)((ulong)layer * 0x25800 + (ulong)ppu->y * 0x3c0 + 0x593422 + (long)x_1 * 4) =
           (char)(ppu->bgbuf[layer][x_1].raw >> 5) << 3 |
           (byte)(ppu->bgbuf[layer][x_1].raw >> 5) & 7;
      *(byte *)((ulong)layer * 0x25800 + (ulong)ppu->y * 0x3c0 + 0x593423 + (long)x_1 * 4) =
           (byte)(ppu->bgbuf[layer][x_1].raw >> 10) << 3 |
           (byte)(ppu->bgbuf[layer][x_1].raw >> 10) & 7;
      dbg_bg_layers[layer][ppu->y][x_1].a = 0xff;
    }
  }
  return;
}

Assistant:

void copy_texture_line(dbg_layer_t layer) {
    if (layer == OBJ) {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            dbg_bg_layers[layer][ppu->y][x].r = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->objbuf[x].r);
            dbg_bg_layers[layer][ppu->y][x].g = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->objbuf[x].g);
            dbg_bg_layers[layer][ppu->y][x].b = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->objbuf[x].b);
            dbg_bg_layers[layer][ppu->y][x].a = 0xFF;
        }
    } else {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            dbg_bg_layers[layer][ppu->y][x].r = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->bgbuf[layer][x].r);
            dbg_bg_layers[layer][ppu->y][x].g = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->bgbuf[layer][x].g);
            dbg_bg_layers[layer][ppu->y][x].b = FIVEBIT_TO_EIGHTBIT_COLOR(ppu->bgbuf[layer][x].b);
            dbg_bg_layers[layer][ppu->y][x].a = 0xFF;
        }
    }
}